

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O0

void __thiscall tf::NonblockingNotifierV2::_unpark(NonblockingNotifierV2 *this,Waiter *w)

{
  uint uVar1;
  ulong __n;
  reference in_RSI;
  long in_RDI;
  unique_lock<std::mutex> lock;
  uint state;
  uint64_t wnext;
  Waiter *next;
  memory_order __b;
  mutex_type *in_stack_ffffffffffffff88;
  reference this_00;
  reference this_01;
  reference local_28;
  
  local_28 = in_RSI;
  while (local_28 != (reference)0x0) {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    __n = (local_28->next).super___atomic_base<unsigned_long>._M_i & 0x3fff;
    if (__n == 0x3fff) {
      this_00 = (reference)0x0;
    }
    else {
      this_00 = std::
                vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                ::operator[]((vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                              *)(in_RDI + 8),__n);
    }
    this_01 = this_00;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)this_00,in_stack_ffffffffffffff88);
    uVar1 = local_28->state;
    local_28->state = 2;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_01);
    local_28 = this_00;
    if (uVar1 == 1) {
      std::condition_variable::notify_one();
    }
  }
  return;
}

Assistant:

void _unpark(Waiter* w) {
    for (Waiter* next; w; w = next) {
      uint64_t wnext = w->next.load(std::memory_order_relaxed) & kStackMask;
      next = (wnext == kStackMask) ? nullptr : &_waiters[static_cast<size_t>(wnext)];
#if __cplusplus >= TF_CPP20
      if(w->state.exchange(Waiter::kSignaled, std::memory_order_relaxed) == 
         Waiter::kWaiting) {
        w->state.notify_one();
      }
#else      
      unsigned state;
      {
        std::unique_lock<std::mutex> lock(w->mu);
        state = w->state;
        w->state = Waiter::kSignaled;
      }
      // Avoid notifying if it wasn't waiting.
      if (state == Waiter::kWaiting) w->cv.notify_one();
#endif
    }
  }